

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O1

int __thiscall
SRUP_Crypto::_decrypt
          (SRUP_Crypto *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  uchar *ek;
  SRUP_Crypto *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  EVP_PKEY *pkey;
  EVP_CIPHER_CTX *ctx_00;
  EVP_CIPHER *pEVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int final_len;
  int body_len;
  uint8_t iv [16];
  uint8_t final [4096];
  uint8_t body [4096];
  int local_2068;
  int local_2064;
  uchar *local_2060;
  SRUP_Crypto *local_2058;
  EVP_CIPHER_CTX *local_2050;
  uchar local_2048 [16];
  uchar local_2038 [4096];
  uchar local_1038 [4104];
  
  pkey = EVP_PKEY_new();
  iVar2 = EVP_PKEY_assign(pkey,6,ctx);
  if (iVar2 == 0) {
    EVP_PKEY_free(pkey);
  }
  else {
    ctx_00 = EVP_CIPHER_CTX_new();
    EVP_CIPHER_CTX_reset(ctx_00);
    iVar2 = *(int *)this->m_crypt;
    sVar7 = (size_t)iVar2;
    iVar3 = EVP_PKEY_get_size(pkey);
    if (iVar2 <= iVar3) {
      uVar8 = 0xffffffffffffffff;
      if (-1 < iVar2) {
        uVar8 = sVar7;
      }
      local_2060 = (uchar *)operator_new__(uVar8);
      memcpy(local_2060,this->m_crypt + 4,sVar7);
      local_2050 = ctx_00;
      pEVar5 = EVP_aes_256_cbc();
      iVar4 = EVP_CIPHER_get_iv_length(pEVar5);
      puVar6 = this->m_crypt;
      local_2058 = this;
      memcpy(local_2048,puVar6 + sVar7 + 4,(long)iVar4);
      ctx_00 = local_2050;
      ek = local_2060;
      iVar9 = iVar4 + iVar2 + 4;
      iVar3 = *(int *)(puVar6 + iVar9);
      iVar4 = *(int *)(puVar6 + (iVar4 + 4 + iVar2 + 4));
      pEVar5 = EVP_aes_256_cbc();
      iVar2 = EVP_OpenInit(ctx_00,pEVar5,ek,iVar2,local_2048,pkey);
      pSVar1 = local_2058;
      if (((iVar2 != 0) &&
          (iVar2 = EVP_DecryptUpdate(ctx_00,local_1038,&local_2064,local_2058->m_crypt + (iVar9 + 8)
                                     ,iVar3), iVar2 != 0)) &&
         (iVar2 = EVP_OpenFinal(ctx_00,local_2038,&local_2068), iVar2 != 0)) {
        sVar7 = (size_t)local_2064;
        pSVar1->m_plain_text_length = (uint16_t)(local_2068 + local_2064);
        puVar6 = (uint8_t *)operator_new__((ulong)(local_2068 + local_2064 & 0xffff));
        pSVar1->m_plain_text = puVar6;
        memcpy(puVar6,local_1038,sVar7);
        memcpy(puVar6 + sVar7,local_2038,(long)iVar4 - sVar7);
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx_00);
        operator_delete__(local_2060);
        return (int)pSVar1->m_plain_text;
      }
      operator_delete__(ek);
    }
    EVP_PKEY_free(pkey);
    EVP_CIPHER_CTX_free(ctx_00);
  }
  return 0;
}

Assistant:

uint8_t* SRUP_Crypto::_decrypt(RSA *rsa_key)
{
    EVP_CIPHER_CTX* ctx;
    EVP_PKEY *pkey;
    uint8_t* evp_key;

    int evp_key_len;
    int iv_len;
    uint8_t body[4096];
    int body_len;
    uint8_t final[4096];
    int final_len;
    uint8_t iv[EVP_MAX_IV_LENGTH];

    int read_size;
    int data_size;

    pkey = EVP_PKEY_new();

    if (!EVP_PKEY_assign_RSA(pkey, rsa_key))
    {
        EVP_PKEY_free(pkey);
        return nullptr;
    }

    ctx=EVP_CIPHER_CTX_new();

    EVP_CIPHER_CTX_init(ctx);
    int x=0;

    // We now start reading data from m_crypt - in the same order as we wrote it...

    // Key length
    std::memcpy(&evp_key_len, m_crypt, sizeof(int));
    x+=sizeof(int);
    if (evp_key_len > EVP_PKEY_size(pkey))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    evp_key = new uint8_t[evp_key_len];

    // Key value
    std::memcpy(evp_key, m_crypt+x, (size_t) evp_key_len);
    x+= evp_key_len;

    // IV (a fixed size...)
    iv_len = EVP_CIPHER_iv_length(EVP_aes_256_cbc());
    std::memcpy(&iv, m_crypt+x, (size_t) iv_len);
    x+=iv_len;

    // Encrypted data size
    std::memcpy(&read_size, m_crypt+x, sizeof(int));
    x+=sizeof(int);

    // Actual data size (excluding padding)
    std::memcpy(&data_size, m_crypt+x, sizeof(int));
    x+=sizeof(int);

    // Now the encrypted data
    // Initialize...
    if (!EVP_OpenInit(ctx, EVP_aes_256_cbc(), evp_key, evp_key_len, iv, pkey))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    // ...read the first block...
    if (!EVP_OpenUpdate(ctx, body, &body_len, m_crypt+x, read_size))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    // ... and then read the final block (including padding)
    // See previous note about expected data sizes...
    if (!EVP_OpenFinal(ctx, final, &final_len))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    m_plain_text_length = (uint16_t) body_len + (uint16_t) final_len;
    m_plain_text = new uint8_t[m_plain_text_length];
    std::memcpy(m_plain_text, body, (size_t) body_len);
    std::memcpy(m_plain_text + body_len, final, (size_t) data_size - body_len);

    EVP_PKEY_free(pkey);
    EVP_CIPHER_CTX_free(ctx);
    delete[] evp_key;

    return m_plain_text;
}